

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltools.hh
# Opt level: O0

int anon_unknown.dwarf_bff3::getAttribute<int>(xmlNodePtr type,char *att_name)

{
  int iVar1;
  _anonymous_namespace_ local_38 [32];
  char *local_18;
  char *att_name_local;
  xmlNodePtr type_local;
  
  local_18 = att_name;
  att_name_local = (char *)type;
  (anonymous_namespace)::getStringAttribute_abi_cxx11_(local_38,type,att_name);
  iVar1 = boost::lexical_cast<int,std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return iVar1;
}

Assistant:

T getAttribute(xmlNodePtr type, char const* att_name)
    { return boost::lexical_cast<T>(getStringAttribute(type, att_name)); }